

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_PickPoint * Internal_ON_PickPoint_UnsetInit(void)

{
  ON_PickPoint *in_RDI;
  ON_PickPoint *unset_pick_point;
  double *p1;
  double *p;
  
  ON_PickPoint::ON_PickPoint(in_RDI);
  p1 = in_RDI->m_t;
  while (p1 < &in_RDI->m_depth) {
    *p1 = -1.23432101234321e+308;
    p1 = p1 + 1;
  }
  return in_RDI;
}

Assistant:

static ON_PickPoint Internal_ON_PickPoint_UnsetInit()
{
  ON_PickPoint unset_pick_point;
  double* p = unset_pick_point.m_t;
  double* p1 = p + sizeof(unset_pick_point.m_t) / sizeof(unset_pick_point.m_t[0]);
  while (p < p1)
    *p++ = ON_UNSET_VALUE;
  return unset_pick_point;
}